

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_block_entry(yaml_parser_t *parser)

{
  size_t *psVar1;
  yaml_token_t **tail;
  yaml_mark_t *pyVar2;
  byte bVar3;
  yaml_simple_key_t *pyVar4;
  byte *pbVar5;
  size_t sVar6;
  yaml_token_t *pyVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  size_t sVar13;
  long lVar14;
  yaml_mark_t start_mark;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  
  if (parser->flow_level == 0) {
    pyVar2 = &parser->mark;
    if (parser->simple_key_allowed == 0) {
      parser->error = YAML_SCANNER_ERROR;
      parser->context = (char *)0x0;
      sVar13 = (parser->mark).line;
      (parser->context_mark).index = pyVar2->index;
      (parser->context_mark).line = sVar13;
      (parser->context_mark).column = (parser->mark).column;
      parser->problem = "block sequence entries are not allowed in this context";
      sVar13 = (parser->mark).line;
      (parser->problem_mark).index = pyVar2->index;
      (parser->problem_mark).line = sVar13;
      sVar13 = (parser->mark).column;
      goto LAB_0010fcc0;
    }
    iVar12 = yaml_parser_roll_indent
                       (parser,(parser->mark).column,-1,YAML_BLOCK_SEQUENCE_START_TOKEN,*pyVar2);
    if (iVar12 == 0) {
      return 0;
    }
  }
  pyVar4 = (parser->simple_keys).top;
  if ((pyVar4[-1].possible == 0) || (pyVar4[-1].required == 0)) {
    pyVar4[-1].possible = 0;
    parser->simple_key_allowed = 1;
    sVar13 = (parser->mark).column;
    sVar8 = (parser->mark).index;
    sVar9 = (parser->mark).line;
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    parser->unread = parser->unread - 1;
    pbVar5 = (parser->buffer).pointer;
    bVar3 = *pbVar5;
    lVar14 = 1;
    if (((char)bVar3 < '\0') &&
       ((lVar14 = 2, (bVar3 & 0xe0) != 0xc0 && (lVar14 = 3, (bVar3 & 0xf0) != 0xe0)))) {
      lVar14 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar5 + lVar14;
    sVar6 = (parser->mark).column;
    sVar10 = (parser->mark).index;
    sVar11 = (parser->mark).line;
    uStack_5c = (undefined4)sVar13;
    uStack_58 = (undefined4)(sVar13 >> 0x20);
    local_68 = (undefined4)(sVar8 >> 0x20);
    uStack_64 = (undefined4)sVar9;
    uStack_60 = (undefined4)(sVar9 >> 0x20);
    tail = &(parser->tokens).tail;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar12 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                   &(parser->tokens).end), iVar12 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      return 0;
    }
    pyVar7 = *tail;
    *tail = pyVar7 + 1;
    pyVar7->type = YAML_BLOCK_ENTRY_TOKEN;
    *(undefined8 *)&pyVar7->field_0x4 = 0;
    *(undefined8 *)((long)&(pyVar7->data).alias.value + 4) = 0;
    *(undefined8 *)((long)&(pyVar7->data).tag.suffix + 4) = 0;
    *(size_t *)((long)&pyVar7->data + 0x14) = sVar8 << 0x20;
    *(ulong *)((long)&(pyVar7->start_mark).index + 4) = CONCAT44(uStack_64,local_68);
    *(ulong *)((long)&(pyVar7->start_mark).line + 4) = CONCAT44(uStack_5c,uStack_60);
    *(undefined4 *)((long)&(pyVar7->start_mark).column + 4) = uStack_58;
    (pyVar7->end_mark).index = sVar10;
    (pyVar7->end_mark).line = sVar11;
    (pyVar7->end_mark).column = sVar6;
    return 1;
  }
  sVar13 = pyVar4[-1].mark.column;
  sVar8 = pyVar4[-1].mark.index;
  sVar9 = pyVar4[-1].mark.line;
  parser->error = YAML_SCANNER_ERROR;
  parser->context = "while scanning a simple key";
  (parser->context_mark).index = sVar8;
  (parser->context_mark).line = sVar9;
  (parser->context_mark).column = sVar13;
  parser->problem = "could not find expected \':\'";
  sVar13 = (parser->mark).line;
  (parser->problem_mark).index = (parser->mark).index;
  (parser->problem_mark).line = sVar13;
  sVar13 = (parser->mark).column;
LAB_0010fcc0:
  (parser->problem_mark).column = sVar13;
  return 0;
}

Assistant:

static int
yaml_parser_fetch_block_entry(yaml_parser_t *parser)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Check if the scanner is in the block context. */

    if (!parser->flow_level)
    {
        /* Check if we are allowed to start a new entry. */

        if (!parser->simple_key_allowed) {
            return yaml_parser_set_scanner_error(parser, NULL, parser->mark,
                    "block sequence entries are not allowed in this context");
        }

        /* Add the BLOCK-SEQUENCE-START token if needed. */

        if (!yaml_parser_roll_indent(parser, parser->mark.column, -1,
                    YAML_BLOCK_SEQUENCE_START_TOKEN, parser->mark))
            return 0;
    }
    else
    {
        /*
         * It is an error for the '-' indicator to occur in the flow context,
         * but we let the Parser detect and report about it because the Parser
         * is able to point to the context.
         */
    }

    /* Reset any potential simple keys on the current flow level. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* Simple keys are allowed after '-'. */

    parser->simple_key_allowed = 1;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the BLOCK-ENTRY token and append it to the queue. */

    TOKEN_INIT(token, YAML_BLOCK_ENTRY_TOKEN, start_mark, end_mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}